

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ConcreteFactory *this;
  undefined4 extraout_var;
  long *plVar2;
  
  this = (ConcreteFactory *)operator_new(8);
  ConcreteFactory::ConcreteFactory(this);
  iVar1 = (*(this->super_Factory)._vptr_Factory[2])(this);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  (*(this->super_Factory)._vptr_Factory[1])(this);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))(plVar2);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	Factory* factory = new ConcreteFactory();
	Product* p = factory->createProduct();

	delete factory;
	delete p;

	return 0;
}